

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

BmsParseTooManyObjectException * __thiscall
BmsParseTooManyObjectException::Message_abi_cxx11_(BmsParseTooManyObjectException *this)

{
  stringstream local_1a0 [8];
  stringstream os;
  ostream local_190 [384];
  BmsParseTooManyObjectException *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Too many object/note exists.");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string
BmsParseTooManyObjectException::Message( void ) const
{
  std::stringstream os;
  os << "Too many object/note exists.";
  return os.str();
}